

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport2.c
# Opt level: O0

void ssh2_transport_special_cmd(PacketProtocolLayer *ppl,SessionSpecialCode code,int arg)

{
  ssh_keyalg *psVar1;
  ssh2_transport_state *s;
  int arg_local;
  SessionSpecialCode code_local;
  PacketProtocolLayer *ppl_local;
  
  if (code == SS_REKEY) {
    if (((ulong)ppl[-9].in_pq & 1) == 0) {
      ppl[-0xb].vt = (PacketProtocolLayerVtable *)"at user request";
      *(undefined4 *)&ppl[-0xb].bpp = 3;
      queue_idempotent_callback(&ppl->ic_process_queue);
    }
  }
  else if (code == SS_XCERT) {
    if (((ulong)ppl[-9].in_pq & 1) == 0) {
      psVar1 = ssh2_hostkey_algs[arg].alg;
      ppl[-0xb].ic_process_queue.fn = (toplevel_callback_fn_t)psVar1;
      ppl[-1].interactor = (Interactor *)psVar1;
      ppl[-0xb].vt = (PacketProtocolLayerVtable *)"cross-certifying new host key";
      *(undefined4 *)&ppl[-0xb].bpp = 3;
      queue_idempotent_callback(&ppl->ic_process_queue);
    }
  }
  else {
    ssh_ppl_special_cmd((PacketProtocolLayer *)ppl[-0xd].ic_process_queue.ctx,code,arg);
  }
  return;
}

Assistant:

static void ssh2_transport_special_cmd(PacketProtocolLayer *ppl,
                                       SessionSpecialCode code, int arg)
{
    struct ssh2_transport_state *s =
        container_of(ppl, struct ssh2_transport_state, ppl);

    if (code == SS_REKEY) {
        if (!s->kex_in_progress) {
            s->rekey_reason = "at user request";
            s->rekey_class = RK_NORMAL;
            queue_idempotent_callback(&s->ppl.ic_process_queue);
        }
    } else if (code == SS_XCERT) {
        if (!s->kex_in_progress) {
            s->cross_certifying = s->hostkey_alg = ssh2_hostkey_algs[arg].alg;
            s->rekey_reason = "cross-certifying new host key";
            s->rekey_class = RK_NORMAL;
            queue_idempotent_callback(&s->ppl.ic_process_queue);
        }
    } else {
        /* Send everything else to the next layer up. This includes
         * SS_PING/SS_NOP, which we _could_ handle here - but it's
         * better to put them in the connection layer, so they'll
         * still work in bare connection mode. */
        ssh_ppl_special_cmd(s->higher_layer, code, arg);
    }
}